

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O0

void t29(void)

{
  int iVar1;
  int iVar2;
  _Bool ok_6;
  _Bool ok_5;
  _Bool ok_4;
  _Bool ok_3;
  _Bool ok_2;
  _Bool ok_1;
  _Bool ok;
  int pos;
  ALLEGRO_USTR *us;
  int local_c;
  undefined8 local_8;
  
  local_8 = al_ustr_new(anon_var_dwarf_b22);
  local_c = 0;
  iVar1 = al_ustr_get_next(local_8,&local_c);
  if (iVar1 == 0x61) {
    log_printf("OK   %s\n","al_ustr_get_next(us, &pos) == \'a\'");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get_next(us, &pos) == \'a\'");
    error = error + 1;
  }
  iVar1 = al_ustr_get_next(local_8,&local_c);
  if (iVar1 == 0xfe) {
    log_printf("OK   %s\n","al_ustr_get_next(us, &pos) == U_thorn");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get_next(us, &pos) == U_thorn");
    error = error + 1;
  }
  iVar1 = al_ustr_get_next(local_8,&local_c);
  if (iVar1 == 0x20ac) {
    log_printf("OK   %s\n","al_ustr_get_next(us, &pos) == U_euro");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get_next(us, &pos) == U_euro");
    error = error + 1;
  }
  iVar1 = al_ustr_get_next(local_8,&local_c);
  if (iVar1 == -1) {
    log_printf("OK   %s\n","al_ustr_get_next(us, &pos) == -1");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get_next(us, &pos) == -1");
    error = error + 1;
  }
  iVar1 = local_c;
  iVar2 = al_ustr_size(local_8);
  if (iVar1 == iVar2) {
    log_printf("OK   %s\n","pos == (int) al_ustr_size(us)");
  }
  else {
    log_printf("FAIL %s\n","pos == (int) al_ustr_size(us)");
    error = error + 1;
  }
  local_c = 2;
  iVar1 = al_ustr_get_next(local_8,&local_c);
  if (iVar1 == -2) {
    log_printf("OK   %s\n","al_ustr_get_next(us, &pos) == -2");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get_next(us, &pos) == -2");
    error = error + 1;
  }
  iVar1 = al_ustr_get_next(local_8,&local_c);
  if (iVar1 == 0x20ac) {
    log_printf("OK   %s\n","al_ustr_get_next(us, &pos) == U_euro");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get_next(us, &pos) == U_euro");
    error = error + 1;
  }
  al_ustr_free(local_8);
  return;
}

Assistant:

static void t29(void)
{
   ALLEGRO_USTR *us = al_ustr_new("aþ€");
   int pos;

   pos = 0;
   CHECK(al_ustr_get_next(us, &pos) == 'a');
   CHECK(al_ustr_get_next(us, &pos) == U_thorn);
   CHECK(al_ustr_get_next(us, &pos) == U_euro);
   CHECK(al_ustr_get_next(us, &pos) == -1);
   CHECK(pos == (int) al_ustr_size(us));

   /* Start in the middle of þ. */
   pos = 2;
   CHECK(al_ustr_get_next(us, &pos) == -2);
   CHECK(al_ustr_get_next(us, &pos) == U_euro);

   al_ustr_free(us);
}